

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_sign_inner
              (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
              secp256k1_sha256 *s2c_sha,secp256k1_ecdsa_s2c_opening *s2c_opening,uchar *s2c_data32,
              uchar *msg32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  bool bVar69;
  bool bVar70;
  bool bVar71;
  bool bVar72;
  bool bVar73;
  bool bVar74;
  bool bVar75;
  secp256k1_scalar *r_00;
  secp256k1_ecdsa_s2c_opening *psVar76;
  int iVar77;
  uint uVar78;
  uint uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  bool bVar84;
  char cVar85;
  uint uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  uint uVar92;
  void *data_size;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  ulong uVar98;
  ulong uVar99;
  ulong uVar100;
  ulong uVar101;
  ulong uVar102;
  ulong uVar103;
  bool bVar104;
  secp256k1_scalar non;
  uchar nonce32 [32];
  secp256k1_scalar msg;
  secp256k1_scalar sec;
  int overflow;
  secp256k1_ge nonce_p;
  secp256k1_ge_storage s_1;
  secp256k1_scalar n;
  uchar b [32];
  int local_254;
  secp256k1_context *local_250;
  secp256k1_scalar *local_248;
  uint local_23c;
  secp256k1_scalar local_238;
  secp256k1_sha256 *local_218;
  secp256k1_ecdsa_s2c_opening *local_210;
  secp256k1_scalar *local_208;
  secp256k1_nonce_function local_200;
  uchar local_1f8 [32];
  secp256k1_scalar local_1d8;
  secp256k1_scalar local_1b8;
  secp256k1_gej local_198;
  secp256k1_ge local_118;
  undefined1 local_b8 [56];
  uint64_t uStack_80;
  secp256k1_scalar local_78;
  uchar local_58 [40];
  
  r->d[2] = 0;
  r->d[3] = 0;
  r->d[0] = 0;
  r->d[1] = 0;
  s->d[2] = 0;
  s->d[3] = 0;
  s->d[0] = 0;
  s->d[1] = 0;
  if (recid != (int *)0x0) {
    *recid = 0;
  }
  local_200 = nonce_function_rfc6979;
  if (noncefp != (secp256k1_nonce_function)0x0) {
    local_200 = noncefp;
  }
  local_250 = ctx;
  local_248 = s;
  local_218 = s2c_sha;
  local_210 = s2c_opening;
  secp256k1_scalar_set_b32(&local_1b8,seckey,(int *)&local_198);
  local_23c = (uint)(((local_1b8.d[2] != 0 || local_1b8.d[3] != 0) ||
                     (local_1b8.d[1] != 0 || local_1b8.d[0] != 0)) && (int)local_198.x.n[0] == 0);
  uVar81 = (ulong)(local_23c ^ 1) - 1;
  local_1b8.d[0] = local_1b8.d[0] & uVar81 | (ulong)(local_23c ^ 1);
  local_1b8.d[1] = local_1b8.d[1] & uVar81;
  local_1b8.d[2] = local_1b8.d[2] & uVar81;
  local_1b8.d[3] = uVar81 & local_1b8.d[3];
  secp256k1_scalar_set_b32(&local_1d8,msg32,(int *)0x0);
  local_250 = (secp256k1_context *)&local_250->ecmult_gen_ctx;
  uVar79 = 0;
  local_208 = r;
  do {
    data_size = noncedata;
    iVar77 = (*local_200)(local_1f8,msg32,seckey,(uchar *)0x0,noncedata,uVar79);
    cVar85 = '\x05';
    bVar104 = iVar77 != 0;
    uVar92 = (uint)bVar104;
    if (bVar104) {
      secp256k1_scalar_set_b32(&local_238,local_1f8,(int *)&local_198);
      uVar78 = (uint)bVar104;
      if (((int)local_198.x.n[0] == 0) &&
         (((local_238.d[1] != 0 || local_238.d[0] != 0) || local_238.d[2] != 0) ||
          local_238.d[3] != 0)) {
        if (s2c_data32 != (uchar *)0x0) {
          secp256k1_ecmult_gen((secp256k1_ecmult_gen_context *)local_250,&local_198,&local_238);
          secp256k1_ge_set_gej(&local_118,&local_198);
          psVar76 = local_210;
          if (local_210 != (secp256k1_ecdsa_s2c_opening *)0x0) {
            secp256k1_ge_to_storage((secp256k1_ge_storage *)local_b8,&local_118);
            *(undefined8 *)(psVar76->data + 0x30) = local_b8._48_8_;
            *(uint64_t *)(psVar76->data + 0x38) = uStack_80;
            *(undefined8 *)(psVar76->data + 0x20) = local_b8._32_8_;
            *(undefined8 *)(psVar76->data + 0x28) = local_b8._40_8_;
            *(undefined8 *)(psVar76->data + 0x10) = local_b8._16_8_;
            *(undefined8 *)(psVar76->data + 0x18) = local_b8._24_8_;
            *(undefined8 *)psVar76->data = local_b8._0_8_;
            *(undefined8 *)(psVar76->data + 8) = local_b8._8_8_;
          }
          iVar77 = secp256k1_ec_commit_tweak
                             ((uchar *)local_b8,&local_118,local_218,s2c_data32,(size_t)data_size);
          if (iVar77 == 0) {
            iVar77 = 0;
          }
          else {
            iVar77 = secp256k1_ec_seckey_tweak_add_helper(&local_238,(uchar *)local_b8);
          }
          if (iVar77 == 0) {
            cVar85 = (iVar77 == 0) * '\x05';
            uVar92 = 0;
            goto LAB_0011f4df;
          }
        }
        local_254 = 0;
        secp256k1_ecmult_gen((secp256k1_ecmult_gen_context *)local_250,&local_198,&local_238);
        secp256k1_ge_set_gej(&local_118,&local_198);
        secp256k1_fe_normalize(&local_118.x);
        secp256k1_fe_normalize(&local_118.y);
        secp256k1_fe_get_b32(local_58,&local_118.x);
        secp256k1_scalar_set_b32(r,local_58,&local_254);
        if (recid != (int *)0x0) {
          *recid = ((uint)local_118.y.n[0] & 1) + local_254 * 2;
        }
        uVar81 = r->d[0];
        uVar82 = r->d[1];
        uVar83 = r->d[2];
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar81;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = local_1b8.d[0];
        uVar87 = SUB168(auVar1 * auVar33,8);
        auVar67._8_8_ = 0;
        auVar67._0_8_ = uVar87;
        local_b8._0_8_ = SUB168(auVar1 * auVar33,0);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar81;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = local_1b8.d[1];
        auVar2 = auVar2 * auVar34;
        uVar93 = SUB168(auVar2 + auVar67,0);
        uVar98 = SUB168(auVar2 + auVar67,8);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar82;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = local_1b8.d[0];
        uVar88 = SUB168(auVar3 * auVar35,8);
        uVar80 = SUB168(auVar3 * auVar35,0);
        local_b8._8_8_ = uVar93 + uVar80;
        uVar80 = (ulong)CARRY8(uVar93,uVar80);
        uVar93 = uVar98 + uVar88;
        uVar99 = uVar93 + uVar80;
        uVar100 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar87,auVar2._0_8_)) +
                  (ulong)(CARRY8(uVar98,uVar88) || CARRY8(uVar93,uVar80));
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar81;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = local_1b8.d[2];
        uVar89 = SUB168(auVar4 * auVar36,8);
        uVar80 = SUB168(auVar4 * auVar36,0);
        uVar87 = uVar99 + uVar80;
        uVar80 = (ulong)CARRY8(uVar99,uVar80);
        uVar88 = uVar100 + uVar89;
        uVar101 = uVar88 + uVar80;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar82;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = local_1b8.d[1];
        uVar90 = SUB168(auVar5 * auVar37,8);
        uVar93 = SUB168(auVar5 * auVar37,0);
        uVar99 = uVar87 + uVar93;
        uVar93 = (ulong)CARRY8(uVar87,uVar93);
        uVar98 = uVar101 + uVar90;
        uVar102 = uVar98 + uVar93;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar83;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = local_1b8.d[0];
        uVar91 = SUB168(auVar6 * auVar38,8);
        uVar87 = SUB168(auVar6 * auVar38,0);
        local_b8._16_8_ = uVar99 + uVar87;
        uVar87 = (ulong)CARRY8(uVar99,uVar87);
        uVar99 = uVar102 + uVar91;
        uVar103 = uVar99 + uVar87;
        uVar94 = (ulong)(CARRY8(uVar100,uVar89) || CARRY8(uVar88,uVar80)) +
                 (ulong)(CARRY8(uVar101,uVar90) || CARRY8(uVar98,uVar93)) +
                 (ulong)(CARRY8(uVar102,uVar91) || CARRY8(uVar99,uVar87));
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar81;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = local_1b8.d[3];
        uVar91 = SUB168(auVar7 * auVar39,8);
        uVar81 = SUB168(auVar7 * auVar39,0);
        uVar87 = uVar103 + uVar81;
        uVar80 = (ulong)CARRY8(uVar103,uVar81);
        uVar98 = uVar94 + uVar91;
        uVar103 = uVar98 + uVar80;
        uVar81 = r->d[3];
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar82;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = local_1b8.d[2];
        uVar100 = SUB168(auVar8 * auVar40,8);
        uVar93 = SUB168(auVar8 * auVar40,0);
        uVar88 = uVar87 + uVar93;
        uVar93 = (ulong)CARRY8(uVar87,uVar93);
        uVar99 = uVar103 + uVar100;
        uVar95 = uVar99 + uVar93;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar83;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = local_1b8.d[1];
        uVar101 = SUB168(auVar9 * auVar41,8);
        uVar87 = SUB168(auVar9 * auVar41,0);
        uVar90 = uVar88 + uVar87;
        uVar87 = (ulong)CARRY8(uVar88,uVar87);
        uVar89 = uVar95 + uVar101;
        uVar96 = uVar89 + uVar87;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar81;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = local_1b8.d[0];
        uVar102 = SUB168(auVar10 * auVar42,8);
        uVar88 = SUB168(auVar10 * auVar42,0);
        local_b8._24_8_ = uVar90 + uVar88;
        uVar88 = (ulong)CARRY8(uVar90,uVar88);
        uVar90 = uVar96 + uVar102;
        uVar97 = uVar90 + uVar88;
        uVar91 = (ulong)(CARRY8(uVar94,uVar91) || CARRY8(uVar98,uVar80)) +
                 (ulong)(CARRY8(uVar103,uVar100) || CARRY8(uVar99,uVar93)) +
                 (ulong)(CARRY8(uVar95,uVar101) || CARRY8(uVar89,uVar87)) +
                 (ulong)(CARRY8(uVar96,uVar102) || CARRY8(uVar90,uVar88));
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar82;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = local_1b8.d[3];
        uVar99 = SUB168(auVar11 * auVar43,8);
        uVar82 = SUB168(auVar11 * auVar43,0);
        uVar93 = uVar97 + uVar82;
        uVar82 = (ulong)CARRY8(uVar97,uVar82);
        uVar87 = uVar91 + uVar99;
        uVar100 = uVar87 + uVar82;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = uVar83;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = local_1b8.d[2];
        uVar89 = SUB168(auVar12 * auVar44,8);
        uVar80 = SUB168(auVar12 * auVar44,0);
        uVar98 = uVar93 + uVar80;
        uVar80 = (ulong)CARRY8(uVar93,uVar80);
        uVar88 = uVar100 + uVar89;
        uVar101 = uVar88 + uVar80;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = uVar81;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = local_1b8.d[1];
        uVar90 = SUB168(auVar13 * auVar45,8);
        uVar93 = SUB168(auVar13 * auVar45,0);
        local_b8._32_8_ = uVar98 + uVar93;
        uVar93 = (ulong)CARRY8(uVar98,uVar93);
        uVar98 = uVar101 + uVar90;
        uVar102 = uVar98 + uVar93;
        uVar98 = (ulong)(CARRY8(uVar91,uVar99) || CARRY8(uVar87,uVar82)) +
                 (ulong)(CARRY8(uVar100,uVar89) || CARRY8(uVar88,uVar80)) +
                 (ulong)(CARRY8(uVar101,uVar90) || CARRY8(uVar98,uVar93));
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar83;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = local_1b8.d[3];
        uVar87 = SUB168(auVar14 * auVar46,8);
        uVar82 = SUB168(auVar14 * auVar46,0);
        uVar93 = uVar102 + uVar82;
        uVar82 = (ulong)CARRY8(uVar102,uVar82);
        uVar80 = uVar98 + uVar87;
        uVar99 = uVar80 + uVar82;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = uVar81;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = local_1b8.d[2];
        uVar88 = SUB168(auVar15 * auVar47,8);
        uVar83 = SUB168(auVar15 * auVar47,0);
        local_b8._40_8_ = uVar93 + uVar83;
        uVar83 = (ulong)CARRY8(uVar93,uVar83);
        uVar93 = uVar99 + uVar88;
        auVar65._8_8_ =
             (ulong)(CARRY8(uVar98,uVar87) || CARRY8(uVar80,uVar82)) +
             (ulong)(CARRY8(uVar99,uVar88) || CARRY8(uVar93,uVar83));
        auVar65._0_8_ = uVar93 + uVar83;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar81;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = local_1b8.d[3];
        unique0x10000606 = auVar16 * auVar48 + auVar65;
        secp256k1_scalar_reduce_512(&local_78,(uint64_t *)local_b8);
        secp256k1_scalar_add(&local_78,&local_78,&local_1d8);
        r_00 = local_248;
        secp256k1_scalar_inverse(local_248,&local_238);
        uVar81 = r_00->d[0];
        uVar82 = r_00->d[1];
        uVar83 = r_00->d[2];
        auVar17._8_8_ = 0;
        auVar17._0_8_ = uVar81;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = local_78.d[0];
        uVar87 = SUB168(auVar17 * auVar49,8);
        auVar68._8_8_ = 0;
        auVar68._0_8_ = uVar87;
        local_b8._0_8_ = SUB168(auVar17 * auVar49,0);
        auVar18._8_8_ = 0;
        auVar18._0_8_ = uVar81;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = local_78.d[1];
        auVar18 = auVar18 * auVar50;
        uVar93 = SUB168(auVar18 + auVar68,0);
        uVar98 = SUB168(auVar18 + auVar68,8);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = uVar82;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = local_78.d[0];
        uVar88 = SUB168(auVar19 * auVar51,8);
        uVar80 = SUB168(auVar19 * auVar51,0);
        local_b8._8_8_ = uVar93 + uVar80;
        uVar80 = (ulong)CARRY8(uVar93,uVar80);
        uVar93 = uVar98 + uVar88;
        uVar99 = uVar93 + uVar80;
        uVar100 = (ulong)CARRY8(auVar18._8_8_,(ulong)CARRY8(uVar87,auVar18._0_8_)) +
                  (ulong)(CARRY8(uVar98,uVar88) || CARRY8(uVar93,uVar80));
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar81;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = local_78.d[2];
        uVar89 = SUB168(auVar20 * auVar52,8);
        uVar80 = SUB168(auVar20 * auVar52,0);
        uVar87 = uVar99 + uVar80;
        uVar80 = (ulong)CARRY8(uVar99,uVar80);
        uVar88 = uVar100 + uVar89;
        uVar101 = uVar88 + uVar80;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = uVar82;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = local_78.d[1];
        uVar90 = SUB168(auVar21 * auVar53,8);
        uVar93 = SUB168(auVar21 * auVar53,0);
        uVar99 = uVar87 + uVar93;
        uVar93 = (ulong)CARRY8(uVar87,uVar93);
        uVar98 = uVar101 + uVar90;
        uVar102 = uVar98 + uVar93;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = uVar83;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = local_78.d[0];
        uVar91 = SUB168(auVar22 * auVar54,8);
        uVar87 = SUB168(auVar22 * auVar54,0);
        local_b8._16_8_ = uVar99 + uVar87;
        uVar87 = (ulong)CARRY8(uVar99,uVar87);
        uVar99 = uVar102 + uVar91;
        uVar103 = uVar99 + uVar87;
        uVar94 = (ulong)(CARRY8(uVar100,uVar89) || CARRY8(uVar88,uVar80)) +
                 (ulong)(CARRY8(uVar101,uVar90) || CARRY8(uVar98,uVar93)) +
                 (ulong)(CARRY8(uVar102,uVar91) || CARRY8(uVar99,uVar87));
        auVar23._8_8_ = 0;
        auVar23._0_8_ = uVar81;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = local_78.d[3];
        uVar91 = SUB168(auVar23 * auVar55,8);
        uVar81 = SUB168(auVar23 * auVar55,0);
        uVar87 = uVar103 + uVar81;
        uVar80 = (ulong)CARRY8(uVar103,uVar81);
        uVar98 = uVar94 + uVar91;
        uVar103 = uVar98 + uVar80;
        uVar81 = r_00->d[3];
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar82;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = local_78.d[2];
        uVar100 = SUB168(auVar24 * auVar56,8);
        uVar93 = SUB168(auVar24 * auVar56,0);
        uVar88 = uVar87 + uVar93;
        uVar93 = (ulong)CARRY8(uVar87,uVar93);
        uVar99 = uVar103 + uVar100;
        uVar95 = uVar99 + uVar93;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar83;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = local_78.d[1];
        uVar101 = SUB168(auVar25 * auVar57,8);
        uVar87 = SUB168(auVar25 * auVar57,0);
        uVar90 = uVar88 + uVar87;
        uVar87 = (ulong)CARRY8(uVar88,uVar87);
        uVar89 = uVar95 + uVar101;
        uVar96 = uVar89 + uVar87;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar81;
        auVar58._8_8_ = 0;
        auVar58._0_8_ = local_78.d[0];
        uVar102 = SUB168(auVar26 * auVar58,8);
        uVar88 = SUB168(auVar26 * auVar58,0);
        local_b8._24_8_ = uVar90 + uVar88;
        uVar88 = (ulong)CARRY8(uVar90,uVar88);
        uVar90 = uVar96 + uVar102;
        uVar97 = uVar90 + uVar88;
        uVar91 = (ulong)(CARRY8(uVar94,uVar91) || CARRY8(uVar98,uVar80)) +
                 (ulong)(CARRY8(uVar103,uVar100) || CARRY8(uVar99,uVar93)) +
                 (ulong)(CARRY8(uVar95,uVar101) || CARRY8(uVar89,uVar87)) +
                 (ulong)(CARRY8(uVar96,uVar102) || CARRY8(uVar90,uVar88));
        auVar27._8_8_ = 0;
        auVar27._0_8_ = uVar82;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = local_78.d[3];
        uVar99 = SUB168(auVar27 * auVar59,8);
        uVar82 = SUB168(auVar27 * auVar59,0);
        uVar93 = uVar97 + uVar82;
        uVar82 = (ulong)CARRY8(uVar97,uVar82);
        uVar87 = uVar91 + uVar99;
        uVar100 = uVar87 + uVar82;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = uVar83;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = local_78.d[2];
        uVar89 = SUB168(auVar28 * auVar60,8);
        uVar80 = SUB168(auVar28 * auVar60,0);
        uVar98 = uVar93 + uVar80;
        uVar80 = (ulong)CARRY8(uVar93,uVar80);
        uVar88 = uVar100 + uVar89;
        uVar101 = uVar88 + uVar80;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uVar81;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = local_78.d[1];
        uVar90 = SUB168(auVar29 * auVar61,8);
        uVar93 = SUB168(auVar29 * auVar61,0);
        local_b8._32_8_ = uVar98 + uVar93;
        uVar93 = (ulong)CARRY8(uVar98,uVar93);
        uVar98 = uVar101 + uVar90;
        uVar102 = uVar98 + uVar93;
        uVar98 = (ulong)(CARRY8(uVar91,uVar99) || CARRY8(uVar87,uVar82)) +
                 (ulong)(CARRY8(uVar100,uVar89) || CARRY8(uVar88,uVar80)) +
                 (ulong)(CARRY8(uVar101,uVar90) || CARRY8(uVar98,uVar93));
        auVar30._8_8_ = 0;
        auVar30._0_8_ = uVar83;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = local_78.d[3];
        uVar87 = SUB168(auVar30 * auVar62,8);
        uVar82 = SUB168(auVar30 * auVar62,0);
        uVar93 = uVar102 + uVar82;
        uVar82 = (ulong)CARRY8(uVar102,uVar82);
        uVar80 = uVar98 + uVar87;
        uVar99 = uVar80 + uVar82;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = uVar81;
        auVar63._8_8_ = 0;
        auVar63._0_8_ = local_78.d[2];
        uVar88 = SUB168(auVar31 * auVar63,8);
        uVar83 = SUB168(auVar31 * auVar63,0);
        local_b8._40_8_ = uVar93 + uVar83;
        uVar83 = (ulong)CARRY8(uVar93,uVar83);
        uVar93 = uVar99 + uVar88;
        auVar66._8_8_ =
             (ulong)(CARRY8(uVar98,uVar87) || CARRY8(uVar80,uVar82)) +
             (ulong)(CARRY8(uVar99,uVar88) || CARRY8(uVar93,uVar83));
        auVar66._0_8_ = uVar93 + uVar83;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = uVar81;
        auVar64._8_8_ = 0;
        auVar64._0_8_ = local_78.d[3];
        unique0x1000063e = auVar32 * auVar64 + auVar66;
        secp256k1_scalar_reduce_512(r_00,(uint64_t *)local_b8);
        local_78.d[0] = 0;
        local_78.d[1] = 0;
        local_78.d[2] = 0;
        local_78.d[3] = 0;
        local_198.x.n[0] = 0;
        local_198.x.n[1] = 0;
        local_198.x.n[2] = 0;
        local_198.x.n[3] = 0;
        local_198.x.n[4] = 0;
        local_198.y.n[0] = 0;
        local_198.y.n[1] = 0;
        local_198.y.n[2] = 0;
        local_198.y.n[3] = 0;
        local_198.y.n[4] = 0;
        local_198.z.n[0] = 0;
        local_198.z.n[1] = 0;
        local_198.z.n[2] = 0;
        local_198.z.n[3]._0_4_ = 0;
        local_198.z.n[3]._4_4_ = 0;
        local_198.z.n[4]._0_4_ = 0;
        local_198._116_8_ = 0;
        local_118.x.n[0] = 0;
        local_118.x.n[1] = 0;
        local_118.x.n[2] = 0;
        local_118.x.n[3] = 0;
        local_118.x.n[4] = 0;
        local_118.y.n[0] = 0;
        local_118.y.n[1] = 0;
        local_118.y.n[2] = 0;
        local_118.y.n[3] = 0;
        local_118.y.n[4] = 0;
        local_118.infinity = 0;
        uVar78 = (uint)(r_00->d[3] >> 0x3f);
        uVar86 = uVar78 ^ 1;
        uVar92 = uVar86;
        if (r_00->d[2] == 0xffffffffffffffff) {
          uVar92 = 0;
        }
        if (0x5d576e7357a4501c < r_00->d[1]) {
          uVar86 = 0;
        }
        uVar86 = (uVar86 | uVar92 | r_00->d[3] < 0x7fffffffffffffff) ^ 1;
        uVar92 = 0;
        if (0xdfe92f46681b20a0 < r_00->d[0]) {
          uVar92 = uVar86;
        }
        if (0x5d576e7357a4501d < r_00->d[1]) {
          uVar92 = uVar86;
        }
        uVar92 = uVar92 | uVar78;
        secp256k1_scalar_cond_negate(r_00,uVar92);
        if (recid != (int *)0x0) {
          *recid = *recid ^ uVar92;
        }
        bVar70 = local_208->d[1] != 0;
        bVar71 = local_208->d[0] != 0;
        bVar69 = local_208->d[2] != 0;
        bVar104 = local_208->d[3] != 0;
        bVar74 = local_248->d[1] != 0;
        bVar75 = local_248->d[0] != 0;
        bVar73 = local_248->d[2] != 0;
        bVar72 = local_248->d[3] != 0;
        bVar84 = (((bVar74 || bVar75) || bVar73) || bVar72) &&
                 (((bVar70 || bVar71) || bVar69) || bVar104);
        uVar92 = (uint)bVar84;
        r = local_208;
        uVar78 = (uint)bVar84;
        if ((((bVar74 || bVar75) || bVar73) || bVar72) &&
            (((bVar70 || bVar71) || bVar69) || bVar104)) {
          cVar85 = '\x05';
          goto LAB_0011f4df;
        }
      }
      uVar92 = uVar78;
      uVar79 = uVar79 + 1;
      cVar85 = '\0';
    }
LAB_0011f4df:
    if (cVar85 != '\0') {
      uVar79 = uVar92 & local_23c ^ 1;
      uVar81 = (ulong)uVar79 - 1;
      r->d[0] = r->d[0] & uVar81;
      r->d[1] = r->d[1] & uVar81;
      r->d[2] = r->d[2] & uVar81;
      r->d[3] = r->d[3] & uVar81;
      local_248->d[0] = local_248->d[0] & uVar81;
      local_248->d[1] = local_248->d[1] & uVar81;
      local_248->d[2] = local_248->d[2] & uVar81;
      local_248->d[3] = local_248->d[3] & uVar81;
      if (recid != (int *)0x0) {
        *recid = uVar79 - 1 & *recid;
      }
      return uVar92 & local_23c;
    }
  } while( true );
}

Assistant:

static int secp256k1_ecdsa_sign_inner(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, secp256k1_sha256* s2c_sha, secp256k1_ecdsa_s2c_opening *s2c_opening, const unsigned char* s2c_data32, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int is_sec_valid;
    unsigned char nonce32[32];
    unsigned int count = 0;
    /* Default initialization here is important so we won't pass uninit values to the cmov in the end */
    *r = secp256k1_scalar_zero;
    *s = secp256k1_scalar_zero;
    if (recid) {
        *recid = 0;
    }
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }
    /* sign-to-contract commitments only work with the default nonce function,
     * because we need to ensure that s2c_data is actually hashed into the nonce and
     * not just ignored. Otherwise an attacker can exfiltrate the secret key by
     * signing the same message thrice with different commitments. */
    VERIFY_CHECK(s2c_data32 == NULL || noncefp == secp256k1_nonce_function_default);

    /* Fail if the secret key is invalid. */
    is_sec_valid = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_one, !is_sec_valid);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    while (1) {
        int is_nonce_valid;
        ret = !!noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
        if (!ret) {
            break;
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non, nonce32);
        /* The nonce is still secret here, but it being invalid is is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        if (is_nonce_valid) {
            if (s2c_data32 != NULL) {
                secp256k1_gej nonce_pj;
                secp256k1_ge nonce_p;

                /* Compute original nonce commitment/pubkey */
                secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &nonce_pj, &non);
                secp256k1_ge_set_gej(&nonce_p, &nonce_pj);
                if (s2c_opening != NULL) {
                    secp256k1_ecdsa_s2c_opening_save(s2c_opening, &nonce_p);
                }

                /* Because the nonce is valid, the nonce point isn't the point
                 * at infinity and we can declassify that information to be able to
                 * serialize the point. */
                secp256k1_declassify(ctx, &nonce_p.infinity, sizeof(nonce_p.infinity));

                /* Tweak nonce with s2c commitment. */
                ret = secp256k1_ec_commit_seckey(&non, &nonce_p, s2c_sha, s2c_data32, 32);
                secp256k1_declassify(ctx, &ret, sizeof(ret)); /* may be secret that the tweak falied, but happens with negligible probability */
                if (!ret) {
                    break;
                }
            }

            ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, r, s, &sec, &msg, &non, recid);
            /* The final signature is no longer a secret, nor is the fact that we were successful or not. */
            secp256k1_declassify(ctx, &ret, sizeof(ret));
            if (ret) {
                break;
            }
        }
        count++;
    }
    /* We don't want to declassify is_sec_valid and therefore the range of
     * seckey. As a result is_sec_valid is included in ret only after ret was
     * used as a branching variable. */
    ret &= is_sec_valid;
    memset(nonce32, 0, 32);
    secp256k1_scalar_clear(&msg);
    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_cmov(r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(s, &secp256k1_scalar_zero, !ret);
    if (recid) {
        const int zero = 0;
        secp256k1_int_cmov(recid, &zero, !ret);
    }
    return ret;
}